

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host-ui-imgui.cc
# Opt level: O0

void __thiscall HostUI::set_palette(HostUI *this,RGBA *palette)

{
  int local_5c;
  GLfloat local_58;
  int i;
  GLfloat p [16];
  RGBA *palette_local;
  HostUI *this_local;
  
  p._56_8_ = palette;
  for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
    (&local_58)[local_5c << 2] = (float)*(byte *)(p._56_8_ + (long)local_5c * 4) / 255.0;
    p[(long)(local_5c << 2) + -1] = (float)*(byte *)(p._56_8_ + 1 + (long)local_5c * 4) / 255.0;
    (&local_58)[local_5c * 4 + 2] = (float)*(byte *)(p._56_8_ + 2 + (long)local_5c * 4) / 255.0;
    (&local_58)[local_5c * 4 + 3] = 1.0;
  }
  (*glUseProgram)(this->program);
  (*glUniform4fv)(this->uPalette,4,&local_58);
  return;
}

Assistant:

void HostUI::set_palette(RGBA palette[4]) {
  GLfloat p[16];
  for (int i = 0; i < 4; ++i) {
    p[i * 4 + 0] = ((palette[i] >> 0) & 255) / 255.0f;
    p[i * 4 + 1] = ((palette[i] >> 8) & 255) / 255.0f;
    p[i * 4 + 2] = ((palette[i] >> 16) & 255) / 255.0f;
    p[i * 4 + 3] = 1.0f;
  }
  glUseProgram(program);
  glUniform4fv(uPalette, 4, p);
}